

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GC.cpp
# Opt level: O0

void __thiscall
luna::GC::AdjustThreshold
          (GC *this,uint alived_count,GenInfo *gen,uint min_threshold,uint max_threshold)

{
  uint max_threshold_local;
  uint min_threshold_local;
  GenInfo *gen_local;
  uint alived_count_local;
  GC *this_local;
  
  if (alived_count != 0) {
    while (gen->threshold_count_ < alived_count << 1) {
      gen->threshold_count_ = gen->threshold_count_ << 1;
    }
    while (alived_count << 2 <= gen->threshold_count_) {
      gen->threshold_count_ = gen->threshold_count_ >> 1;
    }
  }
  if (gen->threshold_count_ < min_threshold) {
    gen->threshold_count_ = min_threshold;
  }
  else if (max_threshold < gen->threshold_count_) {
    gen->threshold_count_ = max_threshold;
  }
  return;
}

Assistant:

void GC::AdjustThreshold(unsigned int alived_count, GenInfo &gen,
                             unsigned int min_threshold,
                             unsigned int max_threshold)
    {
        if (alived_count != 0)
        {
            while (gen.threshold_count_ < 2 * alived_count)
                gen.threshold_count_ *= 2;
            while (gen.threshold_count_ >= 4 * alived_count)
                gen.threshold_count_ /= 2;
        }

        if (gen.threshold_count_ < min_threshold)
            gen.threshold_count_ = min_threshold;
        else if (gen.threshold_count_ > max_threshold)
            gen.threshold_count_ = max_threshold;
    }